

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

_Bool prefix(char *s,char *t)

{
  char cVar1;
  char cVar2;
  char *local_20;
  char *t_local;
  char *s_local;
  
  local_20 = t;
  t_local = s;
  do {
    if (*local_20 == '\0') {
      return true;
    }
    cVar1 = *local_20;
    cVar2 = *t_local;
    local_20 = local_20 + 1;
    t_local = t_local + 1;
  } while (cVar1 == cVar2);
  return false;
}

Assistant:

bool prefix(const char *s, const char *t)
{
	/* Scan "t" */
	while (*t)
	{
		/* Compare content and length */
		if (*t++ != *s++) return (false);
	}

	/* Matched, we have a prefix */
	return (true);
}